

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar.c
# Opt level: O0

void test_write_format_tar(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  mode_t mVar3;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  la_ssize_t lVar7;
  la_int64_t v2;
  ulong local_30;
  size_t blocksize;
  size_t used;
  char *p;
  archive *a;
  archive_entry *ae;
  
  for (local_30 = 1; local_30 < 100000; local_30 = local_30 * 2 + 3) {
    p = (char *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L')',(uint)((archive *)p != (archive *)0x0),
                     "(a = archive_write_new()) != NULL",(void *)0x0);
    iVar2 = archive_write_set_format_ustar((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'+',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",p);
    iVar2 = archive_write_add_filter_none((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",p);
    iVar2 = archive_write_set_bytes_per_block((archive *)p,(int)local_30);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'/',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",p);
    iVar2 = archive_write_set_bytes_in_last_block((archive *)p,(int)local_30);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_in_last_block(a, (int)blocksize)",p);
    iVar2 = archive_write_get_bytes_in_last_block((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'3',local_30,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    iVar2 = archive_write_open_memory((archive *)p,buff,1000000,&blocksize);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",p);
    iVar2 = archive_write_get_bytes_in_last_block((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'7',local_30,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L'<',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime((archive_entry *)a,1,10);
    tVar4 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'>',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    lVar5 = archive_entry_mtime_nsec((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'?',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    used = (size_t)strdup("file");
    archive_entry_copy_pathname((archive_entry *)a,(char *)used);
    strcpy((char *)used,"XXXX");
    free((void *)used);
    pcVar6 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
               ,L'D',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode((archive_entry *)a,0x81ed);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'F',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size((archive_entry *)a,8);
    iVar2 = archive_write_header((archive *)p,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",p);
    archive_entry_free((archive_entry *)a);
    lVar7 = archive_write_data((archive *)p,"12345678",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'K',8,"8",lVar7,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
    iVar2 = archive_write_close((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",p);
    iVar2 = archive_write_free((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    failure("blocksize=%zu",local_30);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_30;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'T',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ff)) / auVar1,0) + 1) *
                              local_30,"((2048 - 1)/blocksize+1)*blocksize",blocksize,"used",
                        (void *)0x0);
    p = (char *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L'Y',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL"
                     ,(void *)0x0);
    iVar2 = archive_read_support_format_all((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'[',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",p);
    iVar2 = archive_read_support_filter_all((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",p);
    iVar2 = archive_read_open_memory((archive *)p,buff,blocksize);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",p
                       );
    iVar2 = archive_read_next_header((archive *)p,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",p);
    tVar4 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'd',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    lVar5 = archive_entry_mtime_nsec((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'f',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar4 = archive_entry_atime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'g',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
    tVar4 = archive_entry_ctime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'h',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar6 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
               ,L'i',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_filetype((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'j',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'k',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    v2 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'l',8,"8",v2,"archive_entry_size(ae)",(void *)0x0);
    lVar7 = archive_read_data((archive *)p,buff2,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'm',8,"8",lVar7,"archive_read_data(a, buff2, 10)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'n',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
    iVar2 = archive_read_next_header((archive *)p,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'r',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",p);
    iVar2 = archive_read_close((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",p);
    iVar2 = archive_read_free((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar)
{
	struct archive_entry *ae;
	struct archive *a;
	char *p;
	size_t used;
	size_t blocksize;

	/* Repeat the following for a variety of odd blocksizes. */
	for (blocksize = 1; blocksize < 100000; blocksize += blocksize + 3) {
		/* Create a new archive in memory. */
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_ustar(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_none(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, (int)blocksize));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));

		/*
		 * Write a file to it.
		 */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, 1, 10);
		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		p = strdup("file");
		archive_entry_copy_pathname(ae, p);
		strcpy(p, "XXXX");
		free(p);
		assertEqualString("file", archive_entry_pathname(ae));
		archive_entry_set_mode(ae, S_IFREG | 0755);
		assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
		archive_entry_set_size(ae, 8);

		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);
		assertEqualInt(8, archive_write_data(a, "12345678", 9));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* This calculation gives "the smallest multiple of
		 * the block size that is at least 2048 bytes". */
		failure("blocksize=%zu", blocksize);
		assertEqualInt(((2048 - 1)/blocksize+1)*blocksize, used);

		/*
		 * Now, read the data back.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used));

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));

		assertEqualInt(1, archive_entry_mtime(ae));
		/* Not the same as above: ustar doesn't store hi-res times. */
		assertEqualInt(0, archive_entry_mtime_nsec(ae));
		assertEqualInt(0, archive_entry_atime(ae));
		assertEqualInt(0, archive_entry_ctime(ae));
		assertEqualString("file", archive_entry_pathname(ae));
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
		assertEqualInt(8, archive_entry_size(ae));
		assertEqualInt(8, archive_read_data(a, buff2, 10));
		assertEqualMem(buff2, "12345678", 8);

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
}